

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1dca6::
ARTScanTest_scanForwardOneLeaf_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTScanTest_scanForwardOneLeaf_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  value_view v;
  key_view kVar4;
  value_view visited_val;
  uint64_t visited_key;
  uint64_t n;
  iterator it;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  AssertHelper local_6b0;
  undefined1 local_6a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_6a0;
  AssertHelper local_698;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_690;
  _Elt_pointer psStack_688;
  _Elt_pointer local_680;
  _Map_pointer local_678;
  undefined1 local_670 [8];
  undefined1 local_668 [48];
  _Elt_pointer local_638;
  byte *local_518;
  ulong local_510;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal(&local_500,0,v,false);
  local_678 = (_Map_pointer)0x0;
  local_680 = (_Elt_pointer)0xffffffffffffffff;
  local_690._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  unodb::detail::qsbr_ptr_base::register_active_ptr((void *)0x0);
  psStack_688 = (_Elt_pointer)0x0;
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
  iterator((iterator *)local_670,&local_500.test_db);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::first
            ((iterator *)local_670);
  while (local_638 != (_Elt_pointer)local_668._16_8_) {
    local_678 = (_Map_pointer)((long)local_678 + 1);
    kVar4 = unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
            iterator::get_key((iterator *)local_670);
    uVar1 = *(undefined8 *)kVar4._M_ptr;
    local_680 = (_Elt_pointer)
                ((ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
                 (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
                 (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                uVar1 << 0x38);
    unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
    get_val((iterator *)local_6a8);
    unodb::detail::qsbr_ptr_base::unregister_active_ptr(local_690._M_head_impl);
    local_690._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8;
    local_6a8 = (undefined1  [8])0x0;
    psStack_688 = (_Elt_pointer)pbStack_6a0;
    unodb::detail::qsbr_ptr_base::unregister_active_ptr((void *)0x0);
    unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
    next((iterator *)local_670);
  }
  if (0x100 < local_510) {
    free(local_518);
  }
  std::
  _Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
  ::~_Deque_base((_Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                  *)local_668);
  local_6a8._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_670,"(1)","(n)",(int *)local_6a8,(unsigned_long *)&local_678);
  if (local_670[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)local_668._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6b0,(Message *)local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    if (local_6a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_6a8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_668,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_668._0_8_);
  }
  local_6a8 = (undefined1  [8])((ulong)local_6a8 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_670,"(visited_key)","(0)",(unsigned_long *)&local_680,
             (int *)local_6a8);
  if (local_670[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_6a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)local_668._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0xe1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6b0,(Message *)local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    if (local_6a8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_6a8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_668,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_668._0_8_);
  }
  bVar2 = std::ranges::__equal_fn::
          operator()<unodb::qsbr_ptr_span<const_std::byte>_&,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,&local_690,&unodb::test::test_values);
  local_6a8[0] = bVar2;
  pbStack_6a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_6b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_670,(internal *)local_6a8,
               (AssertionResult *)"std::ranges::equal(visited_val, unodb::test::test_values[0])",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0xe3,(char *)CONCAT71(local_670._1_7_,local_670[0]));
    testing::internal::AssertHelper::operator=(&local_698,(Message *)&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_698);
    if ((undefined1 *)CONCAT71(local_670._1_7_,local_670[0]) != local_668 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_670._1_7_,local_670[0]),
                      (size_t)(local_668._8_8_ + 1));
    }
    if (local_6b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_6b0.data_ + 8))();
    }
    if (pbStack_6a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_6a0,pbStack_6a0);
    }
  }
  unodb::detail::qsbr_ptr_base::unregister_active_ptr(local_690._M_head_impl);
  if (local_500.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_500.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree(&local_500.values._M_t);
  unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~olc_db
            (&local_500.test_db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanForwardOneLeaf) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  uint64_t n = 0;
  std::uint64_t visited_key{~0ULL};
  typename TypeParam::value_view visited_val{};
  const auto fn = [&n, &visited_key, &visited_val](
                      const unodb::visitor<typename TypeParam::iterator>&
                          v) noexcept(noexcept(v.get_key())) {
    n++;
    visited_key = decode(v.get_key());
    visited_val = v.get_value();
    return false;
  };
  db.scan(fn);
  UNODB_EXPECT_EQ(1, n);
  UNODB_EXPECT_EQ(visited_key, 0);
  UNODB_EXPECT_TRUE(
      std::ranges::equal(visited_val, unodb::test::test_values[0]));
}